

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

void __thiscall ODDLParser::OpenDDLParser::~OpenDDLParser(OpenDDLParser *this)

{
  OpenDDLParser *this_local;
  
  clear(this);
  std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::~vector
            (&this->m_stack);
  std::vector<char,_std::allocator<char>_>::~vector(&this->m_buffer);
  return;
}

Assistant:

OpenDDLParser::~OpenDDLParser() {
    clear();
}